

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall arealights::Application::onUpdate(Application *this,duration *deltaTime)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  EArealightMethod EVar4;
  element_type *peVar5;
  element_type *peVar6;
  ostream *poVar7;
  float *pfVar8;
  void *this_00;
  FreeCameraInputMapper *this_01;
  float local_170;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  int local_bc;
  undefined1 local_b8 [4];
  int numFrames;
  vec3 local_ac;
  vec3 local_a0;
  vec3 local_94;
  tvec2<int,_(glm::precision)0> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>
  *local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>
  *local_38;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materialNames;
  duration *deltaTime_local;
  Application *this_local;
  
  this->_frame = this->_frame + 1;
  materialNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)deltaTime;
  fw::ImGuiApplication::onUpdate(&this->super_ImGuiApplication,deltaTime);
  this_01 = &this->_cameraInputMapper;
  FreeCameraInputMapper::setLock(this_01,(bool)(this->_cameraLocked & 1));
  FreeCameraInputMapper::update
            (this_01,(duration *)
                     materialNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = FreeCameraInputMapper::hadMovement(this_01);
  this->_restartIncrementalRendering = bVar1;
  Interface::render(&this->_interface);
  bVar1 = FreeCameraInputMapper::hadMovement(this_01);
  this->_restartIncrementalRendering = bVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  local_38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>
              *)std::
                begin<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<Material>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<Material>>>>>
                          (&this->_materialMap);
  local_50 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>
              *)std::
                end<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<Material>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<Material>>>>>
                          (&this->_materialMap);
  local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_30);
  local_68 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                transform<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<Material>>*,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<Material>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<Material>>>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,arealights::Application::onUpdate(std::chrono::duration<long,std::ratio<1l,1000000000l>>const&)::__0>
                          (local_38,local_50,local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  Interface::setMaterials(&this->_interface,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x50);
  if ((uVar3 & 1) != 0) {
    this->_screenshotRequested = true;
    std::__cxx11::string::operator=((string *)&this->_screenshotAnnotation,"");
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x49);
  if ((uVar3 & 1) != 0) {
    this->_restartIncrementalRendering = true;
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x4c);
  if ((uVar3 & 1) != 0) {
    this->_cameraLocked = (bool)((this->_cameraLocked ^ 0xffU) & 1);
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x31);
  if ((uVar3 & 1) != 0) {
    glm::tvec2<int,_(glm::precision)0>::tvec2(&local_88,0x400,0x400);
    fw::OpenGLApplication::setWindowSize((OpenGLApplication *)this,&local_88);
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x32);
  if ((uVar3 & 1) != 0) {
    peVar6 = std::__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_camera);
    glm::tvec3<float,(glm::precision)0>::tvec3<double,int,int>
              ((tvec3<float,(glm::precision)0> *)&local_94,0.2617993877991494,0,0);
    fw::FreeCamera::setEulerAngles(peVar6,&local_94);
    peVar6 = std::__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_camera);
    glm::tvec3<float,(glm::precision)0>::tvec3<int,double,int>
              ((tvec3<float,(glm::precision)0> *)&local_a0,0,0.5,5);
    fw::FreeCamera::setWorldPosition(peVar6,&local_a0);
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x33);
  if ((uVar3 & 1) != 0) {
    peVar6 = std::__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_camera);
    glm::tvec3<float,(glm::precision)0>::tvec3<int,double,int>
              ((tvec3<float,(glm::precision)0> *)&local_ac,0,-0.7853981633974483,0);
    fw::FreeCamera::setEulerAngles(peVar6,&local_ac);
    peVar6 = std::__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_camera);
    glm::tvec3<float,(glm::precision)0>::tvec3<int,double,int>
              ((tvec3<float,(glm::precision)0> *)local_b8,5,0.3,5);
    fw::FreeCamera::setWorldPosition(peVar6,(vec3 *)local_b8);
  }
  peVar5 = std::
           __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_keyboardInput);
  uVar3 = (*(peVar5->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar5,0x35);
  if ((uVar3 & 1) != 0) {
    this->_autoscreenshot = true;
    this->_autoscreenshotStep = 0;
    this->_autoscreenshotFrame = 0;
  }
  if ((this->_autoscreenshot & 1U) != 0) {
    if (this->_autoscreenshotStep < 6) {
      if ((this->_autoscreenshotStep == 0) && (this->_autoscreenshotFrame == 0)) {
        std::ofstream::open((char *)&this->_autoscreenshotOutFile,0x214866);
      }
      EVar4 = Interface::getArealightMethod(&this->_interface);
      local_bc = 5;
      if (EVar4 == AREALIGHT_GROUNDTRUTH) {
        local_bc = 1000;
      }
      this->_timeSum = this->_frameTimeMs + this->_timeSum;
      if (this->_autoscreenshotFrame == local_bc * (this->_autoscreenshotStep + 1)) {
        poVar7 = std::operator<<((ostream *)&this->_autoscreenshotOutFile,"method=");
        EVar4 = Interface::getArealightMethod(&this->_interface);
        std::ostream::operator<<(poVar7,EVar4);
        poVar7 = std::operator<<((ostream *)&this->_autoscreenshotOutFile,"\rroughness=");
        local_c0 = 0.05;
        local_c4 = (float)this->_autoscreenshotStep * 0.2;
        pfVar8 = std::max<float>(&local_c0,&local_c4);
        std::ostream::operator<<(poVar7,*pfVar8);
        poVar7 = std::operator<<((ostream *)&this->_autoscreenshotOutFile,"\rtime=");
        EVar4 = Interface::getArealightMethod(&this->_interface);
        if (EVar4 == AREALIGHT_GROUNDTRUTH) {
          local_170 = this->_timeSum;
        }
        else {
          local_170 = this->_timeSum / (float)local_bc;
        }
        this_00 = (void *)std::ostream::operator<<(poVar7,local_170);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        this->_autoscreenshotStep = this->_autoscreenshotStep + 1;
      }
      if ((this->_autoscreenshotStep < 6) &&
         (this->_autoscreenshotFrame == local_bc * this->_autoscreenshotStep)) {
        local_c8 = 0.05;
        local_cc = (float)this->_autoscreenshotStep * 0.2;
        pfVar8 = std::max<float>(&local_c8,&local_cc);
        Interface::setRoughness(&this->_interface,*pfVar8);
        this->_timeSum = 0.0;
        this->_restartIncrementalRendering = true;
      }
      if (this->_autoscreenshotFrame == local_bc * (this->_autoscreenshotStep + 1) + -1) {
        this->_screenshotRequested = true;
      }
      this->_autoscreenshotFrame = this->_autoscreenshotFrame + 1;
    }
    else {
      this->_autoscreenshot = false;
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) != 0) {
        std::operator<<((ostream *)&this->_autoscreenshotOutFile,"Closing.");
        std::ofstream::close();
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void Application::onUpdate(
    const std::chrono::high_resolution_clock::duration& deltaTime
)
{
    ++_frame;

    ImGuiApplication::onUpdate(deltaTime);

    _cameraInputMapper.setLock(_cameraLocked);
    _cameraInputMapper.update(deltaTime);
    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    _interface.render();

    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    std::vector<std::string> materialNames;
    std::transform(std::begin(_materialMap), std::end(_materialMap), std::back_inserter(materialNames),
        [](const std::pair<std::string, std::shared_ptr<Material>> &p) { return p.first; });

    _interface.setMaterials(materialNames);

    if (_keyboardInput->isKeyTapped(GLFW_KEY_P)) {
        _screenshotRequested = true;
        _screenshotAnnotation = "";
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_I)) {
        _restartIncrementalRendering = true;
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_L)) {
        _cameraLocked = !_cameraLocked;
    }

    // Automate screenshot taking

    if (_keyboardInput->isKeyTapped(GLFW_KEY_1)) {
        this->setWindowSize({1024, 1024});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_2)) {
        _camera->setEulerAngles({M_PI*(1.0/12.0), 0, 0});
        _camera->setWorldPosition({0, 0.5, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_3)) {
        _camera->setEulerAngles({0, -M_PI_4, 0});
        _camera->setWorldPosition({5, 0.3, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_5)) {
        _autoscreenshot = true;
        _autoscreenshotStep = 0;
        _autoscreenshotFrame = 0;
    }

    /*
    // Average time measurements
    if (_keyboardInput->isKeyTapped(GLFW_KEY_M)) {
        _measure = true;
        _measureAccumulator = 0.0f;
        _measureFramesNum = 0;
    }

    if (_measure) {
        if (_measureFramesNum < 100) {
            _measureAccumulator += _frameTimeMs;
            ++_measureFramesNum;
        } else {
            _measure = false;
            _lastMeasurement = _measureAccumulator / 100.0f;
        }
    }

    ImGui::Text("Last measurement: %.4f", _lastMeasurement);
    */


    // Autoscreenshoting for paper purposes
    if (_autoscreenshot) {
        if (_autoscreenshotStep <= 5) {
            if (_autoscreenshotStep == 0 && _autoscreenshotFrame == 0) {
                _autoscreenshotOutFile.open("autoscreenshot_log.txt", std::ios_base::app);
            }

            const int numFrames = _interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ? 1000 : 5;

            _timeSum += _frameTimeMs;

            // finalize previous step - all frames done for this one
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep+1)) {
                // log time
                _autoscreenshotOutFile << "method=" << static_cast<int>(_interface.getArealightMethod());
                _autoscreenshotOutFile << "\rroughness=" << std::max(0.05f, _autoscreenshotStep * 0.2f);
                _autoscreenshotOutFile << "\rtime=" << (_interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ?
                    _timeSum :
                    _timeSum / numFrames) << std::endl;
                // go to next step
                ++_autoscreenshotStep;
            }

            // first frame of the new step
            if (_autoscreenshotStep <= 5 && _autoscreenshotFrame == numFrames * _autoscreenshotStep) {
                _interface.setRoughness(std::max(0.05f, _autoscreenshotStep * 0.2f));
                _timeSum = 0.0;
                _restartIncrementalRendering = true;
            }

            // ground truth needs a few frames, that's why there is a waiting period, also for other methods we
            // calculate average for gen time
            // last frame of current step
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep + 1) - 1) {
                _screenshotRequested = true;
            }

            ++_autoscreenshotFrame;
        } else {
            _autoscreenshot = false;
            if (_autoscreenshotOutFile.is_open()) {
                _autoscreenshotOutFile << "Closing.";
                _autoscreenshotOutFile.close();
            }
        }
    }
}